

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<119u,Fixpp::Type::Float>>>::operator()
          (FieldGroupVisitor<Fixpp::FieldRef<Fixpp::TagT<119u,Fixpp::Type::Float>>> *this,
          FieldRef<Fixpp::TagT<119U,_Fixpp::Type::Float>_> *field,ParsingContext *context,
          TagSet<Fixpp::TagT<79U,_Fixpp::Type::String>,_Fixpp::TagT<366U,_Fixpp::Type::Float>,_Fixpp::Required<Fixpp::TagT<80U,_Fixpp::Type::Float>_>,_Fixpp::TagT<81U,_Fixpp::Type::Char>,_Fixpp::TagT<92U,_Fixpp::Type::String>,_Fixpp::TagT<208U,_Fixpp::Type::Boolean>,_Fixpp::TagT<209U,_Fixpp::Type::Int>,_Fixpp::TagT<161U,_Fixpp::Type::String>,_Fixpp::TagT<360U,_Fixpp::Type::Int>,_Fixpp::TagT<361U,_Fixpp::Type::Data>,_Fixpp::TagT<76U,_Fixpp::Type::String>,_Fixpp::TagT<109U,_Fixpp::Type::String>,_Fixpp::TagT<12U,_Fixpp::Type::Float>,_Fixpp::TagT<13U,_Fixpp::Type::Char>,_Fixpp::TagT<153U,_Fixpp::Type::Float>,_Fixpp::TagT<154U,_Fixpp::Type::Float>,_Fixpp::TagT<119U,_Fixpp::Type::Float>,_Fixpp::TagT<120U,_Fixpp::Type::String>,_Fixpp::TagT<155U,_Fixpp::Type::Float>,_Fixpp::TagT<156U,_Fixpp::Type::Char>,_Fixpp::TagT<159U,_Fixpp::Type::Float>,_Fixpp::TagT<160U,_Fixpp::Type::Char>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<136U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<137U,_Fixpp::Type::Float>,_Fixpp::TagT<138U,_Fixpp::Type::String>,_Fixpp::TagT<139U,_Fixpp::Type::Char>_>_>
          *param_3,bool param_4,bool param_5)

{
  StreamCursor *this_00;
  long lVar1;
  char *pcVar2;
  StreamBuf<char> *pSVar3;
  long lVar4;
  char cVar5;
  long lVar6;
  bool bVar7;
  
  this_00 = context->cursor;
  lVar1 = *(long *)&this_00->buf->field_0x8;
  pcVar2 = *(char **)&this_00->buf->field_0x10;
  while( true ) {
    pSVar3 = this_00->buf;
    if (*(long *)&pSVar3->field_0x18 == *(long *)&pSVar3->field_0x10) {
      lVar6 = (**(code **)(*(long *)pSVar3 + 0x38))();
      bVar7 = lVar6 == 0;
    }
    else {
      bVar7 = false;
    }
    if (bVar7) {
      ParsingContext::setError(context,ParsingError,"Expected value after tag %d, got EOF",0x77);
      return;
    }
    pSVar3 = this_00->buf;
    if (*(char **)&pSVar3->field_0x10 < *(char **)&pSVar3->field_0x18) {
      cVar5 = **(char **)&pSVar3->field_0x10;
    }
    else {
      cVar5 = (**(code **)(*(long *)pSVar3 + 0x48))();
    }
    if (cVar5 == '|') break;
    StreamCursor::advance(this_00,1);
  }
  lVar6 = *(long *)&this_00->buf->field_0x10;
  lVar4 = *(long *)&this_00->buf->field_0x8;
  (field->m_view).first = pcVar2;
  (field->m_view).second = (lVar1 + lVar6) - (long)(pcVar2 + lVar4);
  return;
}

Assistant:

void operator()(Field& field,
                            ParsingContext& context, TagSet&, bool, bool)
            {
                static constexpr auto Tag = Field::Tag::Id;
                auto& cursor = context.cursor;

                StreamCursor::Token valueToken(cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value after tag %d, got EOF", Tag);

                auto view = valueToken.view();

                field.set(view);
            }